

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O0

bool __thiscall
slang::ast::CheckerMemberVisitor::isFromChecker(CheckerMemberVisitor *this,Symbol *symbol)

{
  Symbol *this_00;
  Symbol *in_RSI;
  long *in_RDI;
  Symbol *sym;
  Scope *scope;
  Scope *local_38;
  Scope *local_20;
  
  local_20 = Symbol::getParentScope(in_RSI);
  while( true ) {
    if (local_20 == (Scope *)0x0) {
      return false;
    }
    local_38 = (Scope *)0x0;
    if (*in_RDI != 0) {
      local_38 = (Scope *)(*in_RDI + 0x40);
    }
    if (local_20 == local_38) break;
    this_00 = Scope::asSymbol(local_20);
    if (this_00->kind == InstanceBody) {
      return false;
    }
    local_20 = Symbol::getParentScope(this_00);
  }
  return true;
}

Assistant:

bool isFromChecker(const Symbol& symbol) const {
        auto scope = symbol.getParentScope();
        while (scope) {
            if (scope == &body)
                return true;

            auto& sym = scope->asSymbol();
            if (sym.kind == SymbolKind::InstanceBody)
                break;

            scope = sym.getParentScope();
        }
        return false;
    }